

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

ostream * operator<<(ostream *o,span<unsigned_short> *d)

{
  iterator puVar1;
  ostream *this;
  iterator end;
  iterator begin;
  span<unsigned_short> *d_local;
  ostream *o_local;
  
  end = mpt::span<unsigned_short>::begin(d);
  puVar1 = mpt::span<unsigned_short>::end(d);
  if (end != puVar1) {
    std::ostream::operator<<(o,*end);
    while (end = end + 1, end != puVar1) {
      this = std::operator<<(o,' ');
      std::ostream::operator<<(this,*end);
    }
  }
  return o;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const mpt::span<T> &d)
{
	typename mpt::span<T>::iterator begin = d.begin(), end = d.end();
	if (begin == end) {
		return o;
	}
	o << *begin;
	while (++begin != end) {
		o << ' ' << *begin;
	}
	return o;
}